

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxReduce_ReduceVec_Test::TestBody(MxxReduce_ReduceVec_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  size_type sVar7;
  char *pcVar8;
  AssertHelper local_110;
  Message local_108;
  size_type local_100;
  undefined4 local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  int i_1;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> w;
  int local_68;
  int ranksum;
  int i;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> v;
  undefined1 local_30 [4];
  int n;
  comm c;
  MxxReduce_ReduceVec_Test *this_local;
  
  c._24_8_ = this;
  mxx::comm::comm((comm *)local_30);
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _4_4_ = 0xd;
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,0xd,&local_51);
  std::allocator<int>::~allocator(&local_51);
  for (local_68 = 0;
      local_68 <
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_68 = local_68 + 1) {
    iVar2 = mxx::comm::rank((comm *)local_30);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)local_68);
    *pvVar6 = iVar2 + local_68;
  }
  iVar2 = mxx::comm::size((comm *)local_30);
  iVar3 = mxx::comm::size((comm *)local_30);
  iVar4 = mxx::comm::size((comm *)local_30);
  mxx::reduce<int>((vector<int,_std::allocator<int>_> *)&gtest_ar.message_,
                   (vector<int,_std::allocator<int>_> *)local_50,iVar4 / 2,(comm *)local_30);
  iVar4 = mxx::comm::rank((comm *)local_30);
  iVar5 = mxx::comm::size((comm *)local_30);
  if (iVar4 == iVar5 / 2) {
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_);
    local_9c = (int)sVar7;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_98,"n","(int)w.size()",
               (int *)((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4),&local_9c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0xae,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
      testing::Message::~Message(&local_a8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_00145256;
    for (gtest_ar_1.message_.ptr_._0_4_ = 0; iVar4 = (int)gtest_ar_1.message_.ptr_,
        (int)gtest_ar_1.message_.ptr_ <
        v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; gtest_ar_1.message_.ptr_._0_4_ = (int)gtest_ar_1.message_.ptr_ + 1)
    {
      iVar5 = mxx::comm::size((comm *)local_30);
      local_cc = (iVar2 * (iVar3 + -1)) / 2 + iVar4 * iVar5;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_,
                          (long)(int)gtest_ar_1.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_c8,"ranksum + i*c.size()","w[i]",&local_cc,pvVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0xb0,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_00145256;
    }
  }
  else {
    local_f4 = 0;
    local_100 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_);
    testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
              (local_f0,"0u",(uint *)0x1bd52d,(unsigned_long *)&local_f4,&local_100);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0xb3,pcVar8);
      testing::internal::AssertHelper::operator=(&local_110,&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      testing::Message::~Message(&local_108);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_00145256;
  }
  gtest_ar_1.message_.ptr_._4_4_ = 0;
LAB_00145256:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  mxx::comm::~comm((comm *)local_30);
  return;
}

Assistant:

TEST(MxxReduce, ReduceVec) {
    mxx::comm c;
    int n = 13;
    std::vector<int> v(n);

    for (int i = 0; i < n; ++i) {
        v[i] = c.rank() + i;
    }

    int ranksum = (c.size() * (c.size()-1)) / 2;

    std::vector<int> w = mxx::reduce(v, c.size()/2, c);
    if (c.rank() == c.size()/2) {
        ASSERT_EQ(n, (int)w.size());
        for (int i = 0; i < n; ++i) {
            ASSERT_EQ(ranksum + i*c.size(), w[i]);
        }
    } else {
        ASSERT_EQ(0u, w.size());
    }
}